

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

bool embree::operator==(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  __type_conflict _Var1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  vector<embree::Token,_std::allocator<embree::Token>_> *in_RDI;
  uint7 in_stack_ffffffffffffffa8;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  _Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar3 = false;
  if (_Var1) {
    bVar2 = std::operator==(in_RSI,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)(ulong)in_stack_ffffffffffffffa8);
    bVar3 = false;
    if (bVar2) {
      bVar2 = std::operator==((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               *)in_RSI,
                              (vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               *)in_stack_ffffffffffffffc8);
      bVar3 = false;
      if (bVar2) {
        bVar3 = std::operator==((vector<embree::Token,_std::allocator<embree::Token>_> *)in_RSI,
                                in_RDI);
      }
    }
  }
  return bVar3;
}

Assistant:

bool operator ==( const Ref<XML>& a, const Ref<XML>& b ) {
      return a->name == b->name && a->parms == b->parms && a->children == b->children && a->body == b->body;
    }